

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtmelSWIAnalyzerSettings.cpp
# Opt level: O1

void __thiscall
AtmelSWIAnalyzerSettings::LoadSettings(AtmelSWIAnalyzerSettings *this,char *settings)

{
  SimpleArchive text_archive;
  int temp_dl;
  SimpleArchive aSStack_28 [12];
  DecodeLevel local_1c;
  
  SimpleArchive::SimpleArchive(aSStack_28);
  SimpleArchive::SetString((char *)aSStack_28);
  SimpleArchive::operator>>(aSStack_28,&this->mSDAChannel);
  SimpleArchive::operator>>(aSStack_28,(int *)&local_1c);
  this->mDecodeLevel = local_1c;
  AnalyzerSettings::ClearChannels();
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mSDAChannel,true);
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)&this->mSDAChannelInterface);
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mDecodeLevel);
  SimpleArchive::~SimpleArchive(aSStack_28);
  return;
}

Assistant:

void AtmelSWIAnalyzerSettings::LoadSettings( const char* settings )
{
    SimpleArchive text_archive;
    text_archive.SetString( settings );

    text_archive >> mSDAChannel;
    int temp_dl;
    text_archive >> temp_dl;
    mDecodeLevel = static_cast<DecodeLevel>( temp_dl );

    ClearChannels();

    AddChannel( mSDAChannel, CHANNEL_NAME, true );

    UpdateInterfacesFromSettings();
}